

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteBatch::TxnCommit(SQLiteBatch *this)

{
  SQliteExecHandler *pSVar1;
  SQLiteDatabase *pSVar2;
  bool bVar3;
  int iVar4;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *puVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_51;
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_database->m_db != (sqlite3 *)0x0) && (this->m_txn == true)) {
    local_50[0] = (string)SQLiteDatabase::HasActiveTxn(this->m_database);
    inline_assertion_check<true,bool>
              ((bool *)local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
               ,0x29d,"TxnCommit","m_database.HasActiveTxn()");
    puVar5 = inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
                       (&this->m_exec_handler,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                        ,0x29e,"TxnCommit","m_exec_handler");
    pSVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
             .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
    pSVar2 = this->m_database;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"COMMIT TRANSACTION",&local_51);
    iVar4 = (*pSVar1->_vptr_SQliteExecHandler[2])(pSVar1,pSVar2,local_50);
    std::__cxx11::string::~string(local_50);
    if (iVar4 == 0) {
      this->m_txn = false;
      CSemaphore::post(&this->m_database->m_write_semaphore);
      bVar3 = true;
      goto LAB_001af621;
    }
    logging_function._M_str = "TxnCommit";
    logging_function._M_len = 9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x2a0,ALL,Info,(ConstevalFormatString<0U>)0x3f2dae);
  }
  bVar3 = false;
LAB_001af621:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::TxnCommit()
{
    if (!m_database.m_db || !m_txn) return false;
    Assert(m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "COMMIT TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to commit the transaction\n");
    } else {
        m_txn = false;
        m_database.m_write_semaphore.post();
    }
    return res == SQLITE_OK;
}